

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<long_double>::make_l2_norm
          (default_cost_type<long_double> *this,int n)

{
  longdouble *plVar1;
  long lVar2;
  longdouble lVar3;
  long local_18;
  ushort uStack_10;
  
  plVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  lVar3 = (longdouble)0;
  for (lVar2 = 0; (ulong)(uint)n << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    lVar3 = *(longdouble *)((long)plVar1 + lVar2) * *(longdouble *)((long)plVar1 + lVar2) + lVar3;
  }
  local_18 = SUB108(lVar3,0);
  uStack_10 = (ushort)((unkuint10)lVar3 >> 0x40);
  if ((ushort)((uStack_10 & 0x7fff) - 1) < 0x7ffe && local_18 < 0) {
    for (lVar2 = 0; (ulong)(uint)n << 4 != lVar2; lVar2 = lVar2 + 0x10) {
      *(longdouble *)((long)plVar1 + lVar2) = *(longdouble *)((long)plVar1 + lVar2) / lVar3;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }